

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

void __thiscall
type_safe::
basic_variant<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>::
value(basic_variant<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>
      *this)

{
  char *local_30;
  undefined4 local_28;
  basic_variant<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>
  *local_20;
  basic_variant<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>
  *local_18;
  basic_variant<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>
  *this_local;
  
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/variant.hpp"
  ;
  local_28 = 0x158;
  local_20 = this;
  local_18 = this;
  debug_assert::detail::
  do_assert<type_safe::basic_variant<type_safe::detail::non_empty_variant_policy<false>,int,evil_variant_test_type>::value(type_safe::union_type<type_safe::nullvar_t>)const::_lambda()_1_,type_safe::detail::precondition_error_handler>
            (&local_20,&local_30,"!has_value()");
  return;
}

Assistant:

nullvar_t value(variant_type<nullvar_t>) const noexcept
    {
        DEBUG_ASSERT(!has_value(), detail::precondition_error_handler{});
        return nullvar;
    }